

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

void matd_utriangle_solve(matd_t *u,double *b,double *x)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  uVar1 = u->ncols;
  if (-1 < (int)(uVar1 - 1)) {
    uVar5 = uVar1 * uVar1;
    lVar3 = 0;
    uVar6 = (ulong)(uVar1 - 1);
    uVar7 = (ulong)uVar1;
    do {
      dVar9 = b[uVar6];
      lVar8 = lVar3;
      uVar4 = uVar5;
      if ((uint)uVar7 < uVar1) {
        do {
          dVar9 = dVar9 - (double)u[(ulong)uVar4 + 1] * x[(ulong)uVar1 + lVar8];
          lVar8 = lVar8 + 1;
          uVar4 = uVar4 + 1;
        } while ((int)lVar8 != 0);
      }
      x[uVar6] = dVar9 / (double)u[(ulong)((uVar1 + 1) * (int)uVar6) + 1];
      uVar7 = uVar7 - 1;
      lVar3 = lVar3 + -1;
      uVar5 = uVar5 + ~uVar1;
      bVar2 = 0 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void matd_utriangle_solve(matd_t *u, const TYPE *b, TYPE *x)
{
    for (int i = u->ncols-1; i >= 0; i--) {
        double bi = b[i];

        double diag = MATD_EL(u, i, i);

        for (int j = i+1; j < u->ncols; j++)
            bi -= MATD_EL(u, i, j)*x[j];

        x[i] = bi / diag;
    }
}